

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O2

ostream * operator<<(ostream *ostream,Clique *clique)

{
  int iVar1;
  size_type pos;
  undefined4 extraout_var;
  ostream *poVar2;
  pointer puVar3;
  bool bVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  alignment_id_t local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                  (clique->alignment_set);
  for (; pos != 0xffffffffffffffff;
      pos = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                      (clique->alignment_set,pos)) {
    iVar1 = (*clique->parent->_vptr_CliqueFinder[5])(clique->parent,pos);
    local_4c = AlignmentRecord::getID((AlignmentRecord *)CONCAT44(extraout_var,iVar1));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
  }
  poVar2 = std::operator<<(ostream,"[");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"]");
  std::operator<<(ostream,"(");
  iVar1 = 0;
  for (puVar3 = local_48._M_impl.super__Vector_impl_data._M_start;
      puVar3 != local_48._M_impl.super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    bVar4 = iVar1 != 0;
    iVar1 = iVar1 + -1;
    if (bVar4) {
      std::operator<<(ostream,",");
    }
    std::ostream::_M_insert<unsigned_long>((ulong)ostream);
  }
  std::operator<<(ostream,")");
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return ostream;
}

Assistant:

ostream& operator<<(ostream& ostream, const Clique& clique) {
	vector<alignment_id_t> ids;
	for (size_t i=clique.alignment_set->find_first(); i!=alignment_set_t::npos; i=clique.alignment_set->find_next(i)) {
		ids.push_back(clique.parent.getAlignmentByIndex(i).getID());
	}
	//sort(ids.begin(), ids.end());
	ostream << "[" << clique.leftmost_segment_start << ":" << clique.rightmost_segment_end << "]";
	ostream << "(";
	int n = 0;
	vector<alignment_id_t>::const_iterator it = ids.begin();
	for (; it!=ids.end(); ++it) {
		if (n++>0) ostream << ",";
		ostream << *it;
	}
	ostream << ")";
	return ostream;
}